

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::GenFSCube<tcu::Vector<unsigned_int,4>>
          (string *__return_storage_ptr__,BasicAllTargetsLoadNonMS *this,GLenum internalformat,
          Vector<unsigned_int,_4> *expected_value)

{
  ostream *poVar1;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream os;
  Vector<unsigned_int,_4> *expected_value_local;
  GLenum internalformat_local;
  BasicAllTargetsLoadNonMS *this_local;
  
  os._368_8_ = expected_value;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,
                           "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_1f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_210,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_230,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,
                           "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_250,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,
                           "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_270,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_290,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_2b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_2d0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_2f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2f0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_310,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_310);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_330,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_330);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_350,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_350);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_370,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_370);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_390,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_390);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_3b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3b0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_3d0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3d0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_3f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3f0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_410,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_410);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_430,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_430);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_450,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_450);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_470,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_470);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,
                           ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_490,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_490);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  std::operator<<(poVar1,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}");
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenFSCube(GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>()
		   << "imageCubeArray g_image_cube_array;" NL "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL
			  "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  "
		   << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_cube, ivec3(coord, 0));" NL "  if (v != " << TypePrefix<T>()
		   << "vec4" << expected_value << ") o_color = vec4(1.0, 0.0, 0.0, 0.3);" NL
										  "  v = imageLoad(g_image_cube, ivec3(coord, 1));" NL "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.35);" NL "  v = imageLoad(g_image_cube, ivec3(coord, 2));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.4);" NL "  v = imageLoad(g_image_cube, ivec3(coord, 3));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.45);" NL "  v = imageLoad(g_image_cube, ivec3(coord, 4));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.5);" NL "  v = imageLoad(g_image_cube, ivec3(coord, 5));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.55);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 0));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.05);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 1));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.1);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 2));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.15);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 3));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.2);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 4));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.25);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 5));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.3);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 6));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.35);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 7));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.4);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 8));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.45);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 9));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.5);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 10));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value
		   << ") o_color = vec4(1.0, 0.0, 0.0, 0.55);" NL "  v = imageLoad(g_image_cube_array, ivec3(coord, 11));" NL
			  "  if (v != "
		   << TypePrefix<T>() << "vec4" << expected_value << ") o_color = vec4(1.0, 0.0, 0.0, 0.6);" NL "}";
		return os.str();
	}